

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  size_t sVar2;
  size_t sVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  float *pfVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  float fVar24;
  float fVar25;
  undefined1 auVar23 [16];
  float fVar26;
  
  fVar22 = (this->super_Dropout).scale;
  if (fVar22 != 1.0) {
    iVar11 = bottom_top_blob->dims;
    auVar23 = ZEXT416((uint)fVar22);
    if (bottom_top_blob->elempack == 4) {
      uVar10 = bottom_top_blob->w;
      uVar18 = bottom_top_blob->h;
      auVar23 = vshufps_avx(auVar23,auVar23,0);
      fVar22 = auVar23._0_4_;
      fVar24 = auVar23._4_4_;
      fVar25 = auVar23._8_4_;
      fVar26 = auVar23._12_4_;
      if (iVar11 == 3) {
        uVar14 = 0;
        iVar11 = uVar18 * uVar10;
        if ((int)(uVar18 * uVar10) < 1) {
          iVar11 = 0;
        }
        uVar15 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar15 = 0;
        }
        for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          pfVar17 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar19 = iVar11;
          while (bVar21 = iVar19 != 0, iVar19 = iVar19 + -1, bVar21) {
            *pfVar17 = fVar22 * *pfVar17;
            pfVar17[1] = fVar24 * pfVar17[1];
            pfVar17[2] = fVar25 * pfVar17[2];
            pfVar17[3] = fVar26 * pfVar17[3];
            pfVar17 = pfVar17 + 4;
          }
        }
      }
      else if (iVar11 == 2) {
        uVar14 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar15 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar15 = uVar14;
        }
        for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          pfVar17 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar18 = uVar10;
          while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
            *pfVar17 = fVar22 * *pfVar17;
            pfVar17[1] = fVar24 * pfVar17[1];
            pfVar17[2] = fVar25 * pfVar17[2];
            pfVar17[3] = fVar26 * pfVar17[3];
            pfVar17 = pfVar17 + 4;
          }
        }
      }
      else if (iVar11 == 1) {
        lVar12 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (; (ulong)uVar10 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar12);
          fVar4 = pfVar17[1];
          fVar5 = pfVar17[2];
          fVar6 = pfVar17[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar12);
          *pfVar1 = fVar22 * *pfVar17;
          pfVar1[1] = fVar24 * fVar4;
          pfVar1[2] = fVar25 * fVar5;
          pfVar1[3] = fVar26 * fVar6;
        }
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        if ((this->super_Dropout).scale != 1.0) {
          uVar10 = bottom_top_blob->h * bottom_top_blob->w;
          sVar2 = bottom_top_blob->cstep;
          sVar3 = bottom_top_blob->elemsize;
          uVar15 = 0;
          uVar14 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar14 = uVar15;
          }
          pvVar16 = bottom_top_blob->data;
          uVar13 = (ulong)(uint)bottom_top_blob->c;
          if (bottom_top_blob->c < 1) {
            uVar13 = uVar15;
          }
          for (; uVar15 != uVar13; uVar15 = uVar15 + 1) {
            for (uVar20 = 0; uVar14 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar16 + uVar20 * 4) =
                   (this->super_Dropout).scale * *(float *)((long)pvVar16 + uVar20 * 4);
            }
            pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar3);
          }
        }
        return 0;
      }
      uVar10 = bottom_top_blob->w;
      uVar18 = bottom_top_blob->h;
      auVar23 = vshufps_avx(auVar23,auVar23,0);
      fVar22 = auVar23._0_4_;
      fVar24 = auVar23._4_4_;
      fVar25 = auVar23._8_4_;
      fVar26 = auVar23._12_4_;
      if (iVar11 == 3) {
        uVar14 = 0;
        iVar11 = uVar18 * uVar10;
        if ((int)(uVar18 * uVar10) < 1) {
          iVar11 = 0;
        }
        uVar15 = (ulong)(uint)bottom_top_blob->c;
        if (bottom_top_blob->c < 1) {
          uVar15 = 0;
        }
        for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          pfVar17 = (float *)(bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar19 = iVar11;
          while (bVar21 = iVar19 != 0, iVar19 = iVar19 + -1, bVar21) {
            *pfVar17 = fVar22 * *pfVar17;
            pfVar17[1] = fVar24 * pfVar17[1];
            pfVar17[2] = fVar25 * pfVar17[2];
            pfVar17[3] = fVar26 * pfVar17[3];
            pfVar17[4] = fVar22 * pfVar17[4];
            pfVar17[5] = fVar24 * pfVar17[5];
            pfVar17[6] = fVar25 * pfVar17[6];
            pfVar17[7] = 0.0;
            pfVar17 = pfVar17 + 8;
          }
        }
      }
      else if (iVar11 == 2) {
        uVar14 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar15 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar15 = uVar14;
        }
        for (; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          pfVar17 = (float *)((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar18 = uVar10;
          while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
            *pfVar17 = fVar22 * *pfVar17;
            pfVar17[1] = fVar24 * pfVar17[1];
            pfVar17[2] = fVar25 * pfVar17[2];
            pfVar17[3] = fVar26 * pfVar17[3];
            pfVar17[4] = fVar22 * pfVar17[4];
            pfVar17[5] = fVar24 * pfVar17[5];
            pfVar17[6] = fVar25 * pfVar17[6];
            pfVar17[7] = 0.0;
            pfVar17 = pfVar17 + 8;
          }
        }
      }
      else if (iVar11 == 1) {
        lVar12 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (; (ulong)uVar10 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar12);
          fVar4 = pfVar17[1];
          fVar5 = pfVar17[2];
          fVar6 = pfVar17[3];
          fVar7 = pfVar17[4];
          fVar8 = pfVar17[5];
          fVar9 = pfVar17[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar12);
          *pfVar1 = fVar22 * *pfVar17;
          pfVar1[1] = fVar24 * fVar4;
          pfVar1[2] = fVar25 * fVar5;
          pfVar1[3] = fVar26 * fVar6;
          pfVar1[4] = fVar22 * fVar7;
          pfVar1[5] = fVar24 * fVar8;
          pfVar1[6] = fVar25 * fVar9;
          pfVar1[7] = 0.0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}